

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O1

char * google::GetHex(char *start,char *end,uint64_t *hex)

{
  byte bVar1;
  int iVar2;
  
  *hex = 0;
  if (start < end) {
    do {
      bVar1 = *start;
      if ((9 < (byte)(bVar1 - 0x30)) &&
         ((0x25 < bVar1 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) == 0))))
      break;
      iVar2 = ((int)(char)bVar1 & 0xfU) + 9;
      if ((char)bVar1 < 'A') {
        iVar2 = (int)(char)bVar1 - 0x30;
      }
      *hex = (long)iVar2 | *hex << 4;
      start = (char *)((byte *)start + 1);
    } while (start != end);
  }
  if (end < start) {
    abort();
  }
  return (char *)(byte *)start;
}

Assistant:

static char *GetHex(const char *start, const char *end, uint64_t *hex) {
  *hex = 0;
  const char *p;
  for (p = start; p < end; ++p) {
    int ch = *p;
    if ((ch >= '0' && ch <= '9') ||
        (ch >= 'A' && ch <= 'F') || (ch >= 'a' && ch <= 'f')) {
      *hex = (*hex << 4) | (ch < 'A' ? ch - '0' : (ch & 0xF) + 9);
    } else {  // Encountered the first non-hex character.
      break;
    }
  }
  SAFE_ASSERT(p <= end);
  return const_cast<char *>(p);
}